

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib503.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  char *pcVar6;
  long lVar7;
  undefined8 uVar8;
  timeval tVar9;
  undefined8 uStack_1d0;
  int maxfd;
  int running;
  timeval interval;
  fd_set rd;
  fd_set exc;
  fd_set wr;
  
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar8 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar8,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib503.c"
                  ,0x2f,iVar1,uVar2);
    goto LAB_0010250a;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    lVar7 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib503.c"
                  ,0x31);
    iVar1 = 0x7c;
    goto LAB_001024ea;
  }
  iVar1 = curl_easy_setopt(lVar3,0x2714,libtest_arg2);
  uVar8 = _stderr;
  if (iVar1 == 0) {
    iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar6 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar7 = 0;
      uStack_1d0 = 0x34;
      goto LAB_001024d9;
    }
    iVar1 = curl_easy_setopt(lVar3,0x2715,"test:ing");
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar6 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar7 = 0;
      uStack_1d0 = 0x35;
      goto LAB_001024d9;
    }
    iVar1 = curl_easy_setopt(lVar3,0x2716,"test:ing");
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar6 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar7 = 0;
      uStack_1d0 = 0x36;
      goto LAB_001024d9;
    }
    iVar1 = curl_easy_setopt(lVar3,0x3d,1);
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar6 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar7 = 0;
      uStack_1d0 = 0x37;
      goto LAB_001024d9;
    }
    iVar1 = curl_easy_setopt(lVar3,0x2a,1);
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar6 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar7 = 0;
      uStack_1d0 = 0x38;
      goto LAB_001024d9;
    }
    iVar1 = curl_easy_setopt(lVar3,0x29,1);
    uVar8 = _stderr;
    if (iVar1 != 0) {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar6 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar7 = 0;
      uStack_1d0 = 0x39;
      goto LAB_001024d9;
    }
    lVar7 = curl_multi_init();
    if (lVar7 == 0) {
      lVar7 = 0;
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib503.c"
                    ,0x3b);
      iVar1 = 0x7b;
    }
    else {
      iVar1 = curl_multi_add_handle(lVar7,lVar3);
      uVar8 = _stderr;
      if (iVar1 != 0) {
        uVar2 = curl_multi_strerror(iVar1);
        pcVar6 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
        uStack_1d0 = 0x3d;
        goto LAB_001024d9;
      }
      do {
        maxfd = -99;
        interval.tv_sec = 1;
        interval.tv_usec = 0;
        iVar1 = curl_multi_perform(lVar7,&running);
        uVar8 = _stderr;
        if (iVar1 != 0) {
          uVar2 = curl_multi_strerror(iVar1);
          pcVar6 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
          uStack_1d0 = 0x47;
          goto LAB_001024d9;
        }
        if (running < 0) {
          pcVar6 = 
          "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n";
          uStack_1d0 = 0x47;
LAB_00102793:
          curl_mfprintf(_stderr,pcVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib503.c"
                        ,uStack_1d0);
          iVar1 = 0x7a;
          goto LAB_001024ea;
        }
        tVar9 = tutil_tvnow();
        lVar4 = tutil_tvdiff(tVar9,tv_test_start);
        if (60000 < lVar4) {
          uStack_1d0 = 0x49;
          goto LAB_0010273b;
        }
        if (running == 0) {
          iVar1 = 0;
          goto LAB_001024ea;
        }
        for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
          rd.__fds_bits[lVar4] = 0;
        }
        for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
          wr.__fds_bits[lVar4] = 0;
        }
        for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
          exc.__fds_bits[lVar4] = 0;
        }
        iVar1 = curl_multi_fdset(lVar7,&rd,&wr,&exc,&maxfd);
        uVar8 = _stderr;
        if (iVar1 != 0) {
          uVar2 = curl_multi_strerror(iVar1);
          pcVar6 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
          uStack_1d0 = 0x52;
          goto LAB_001024d9;
        }
        if (maxfd < -1) {
          pcVar6 = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
          uStack_1d0 = 0x52;
          goto LAB_00102793;
        }
        iVar1 = select_wrapper(maxfd + 1,&rd,&wr,&exc,&interval);
        if (iVar1 == -1) {
          piVar5 = __errno_location();
          uVar8 = _stderr;
          iVar1 = *piVar5;
          pcVar6 = strerror(iVar1);
          curl_mfprintf(uVar8,"%s:%d select() failed, with errno %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib503.c"
                        ,0x56,iVar1,pcVar6);
          iVar1 = 0x79;
          goto LAB_001024ea;
        }
        tVar9 = tutil_tvnow();
        lVar4 = tutil_tvdiff(tVar9,tv_test_start);
      } while (lVar4 < 0xea61);
      uStack_1d0 = 0x58;
LAB_0010273b:
      curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib503.c"
                    ,uStack_1d0);
      iVar1 = 0x7d;
    }
  }
  else {
    uVar2 = curl_easy_strerror(iVar1);
    pcVar6 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
    lVar7 = 0;
    uStack_1d0 = 0x33;
LAB_001024d9:
    curl_mfprintf(uVar8,pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib503.c"
                  ,uStack_1d0,iVar1,uVar2);
  }
LAB_001024ea:
  curl_multi_remove_handle(lVar7,lVar3);
  curl_multi_cleanup(lVar7);
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
LAB_0010250a:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *c = NULL;
  CURLM *m = NULL;
  int res = 0;
  int running;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(c);

  easy_setopt(c, CURLOPT_PROXY, libtest_arg2); /* set in first.c */
  easy_setopt(c, CURLOPT_URL, URL);
  easy_setopt(c, CURLOPT_USERPWD, "test:ing");
  easy_setopt(c, CURLOPT_PROXYUSERPWD, "test:ing");
  easy_setopt(c, CURLOPT_HTTPPROXYTUNNEL, 1L);
  easy_setopt(c, CURLOPT_HEADER, 1L);
  easy_setopt(c, CURLOPT_VERBOSE, 1L);

  multi_init(m);

  multi_add_handle(m, c);

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PA */

  curl_multi_remove_handle(m, c);
  curl_multi_cleanup(m);
  curl_easy_cleanup(c);
  curl_global_cleanup();

  return res;
}